

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

int katherine_set_acq_mode
              (katherine_device_t *device,katherine_acquisition_mode_t acq_mode,
              _Bool fast_vco_enabled)

{
  int iVar1;
  byte local_2c [6];
  undefined1 local_26;
  char cmd [8];
  int res;
  _Bool fast_vco_enabled_local;
  katherine_acquisition_mode_t acq_mode_local;
  katherine_device_t *device_local;
  
  cmd[7] = fast_vco_enabled;
  cmd._0_4_ = katherine_udp_mutex_lock(&device->control_socket);
  if (cmd._0_4_ == 0) {
    memset(local_2c,0,8);
    local_26 = 9;
    local_2c[0] = local_2c[0] | (byte)acq_mode | cmd[7] << 7;
    cmd._0_4_ = katherine_cmd(&device->control_socket,local_2c,8);
    if ((cmd._0_4_ == 0) &&
       (cmd._0_4_ = katherine_cmd_wait_ack(&device->control_socket), cmd._0_4_ == 0)) {
      katherine_udp_mutex_unlock(&device->control_socket);
      return 0;
    }
  }
  katherine_udp_mutex_unlock(&device->control_socket);
  iVar1._0_1_ = cmd[0];
  iVar1._1_1_ = cmd[1];
  iVar1._2_1_ = cmd[2];
  iVar1._3_1_ = cmd[3];
  return iVar1;
}

Assistant:

int
katherine_set_acq_mode(katherine_device_t *device, katherine_acquisition_mode_t acq_mode, bool fast_vco_enabled)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    char cmd[8] = {0};
    cmd[6] = CMD_TYPE_ACQUISITION_MODE_SETTING;

    cmd[0] |= acq_mode;
    cmd[0] |= fast_vco_enabled << 7;

    res = katherine_cmd(&device->control_socket, &cmd, sizeof(cmd));
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}